

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O0

int __thiscall TextFile::close(TextFile *this,int __fd)

{
  bool bVar1;
  TextFile *this_local;
  
  bVar1 = isOpen(this);
  if ((bVar1) && ((this->fromMemory & 1U) == 0)) {
    bufDrainWrite(this);
    std::fstream::close();
  }
  this->bufPos = 0;
  return (int)this;
}

Assistant:

void TextFile::close()
{
	if (isOpen() && !fromMemory)
	{
		bufDrainWrite();
		stream.close();
	}
	bufPos = 0;
}